

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcpclient.cpp
# Opt level: O1

int __thiscall uv::TCPClient::Send(TCPClient *this,char *data,size_t len)

{
  char *__s;
  long lVar1;
  pointer pcVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  ssize_t sVar6;
  ILog4zManager *pIVar7;
  undefined8 in_RCX;
  size_t __n;
  ulong uVar8;
  char *pcVar9;
  uint uVar10;
  int iVar11;
  long *in_FS_OFFSET;
  long *local_50 [2];
  long local_40 [2];
  
  __n = CONCAT71((int7)((ulong)in_RCX >> 8),len != 0);
  if (data != (char *)0x0 && len != 0) {
    uv_async_send(&this->async_handle_);
    uVar8 = 0;
    if (this->isuseraskforclosed_ == false) {
      uVar8 = 0;
      do {
        uv_mutex_lock(&this->mutex_writebuf_);
        sVar6 = PodCircularBuffer<char>::write
                          (&this->write_circularbuf_,(int)data + (int)uVar8,
                           (void *)(ulong)(uint)((int)len - (int)uVar8),__n);
        uVar8 = (long)(int)sVar6 + uVar8;
        uv_mutex_unlock(&this->mutex_writebuf_);
        if (len <= uVar8) break;
        usleep(100000);
      } while (this->isuseraskforclosed_ != true);
    }
    uv_async_send(&this->async_handle_);
    return (int)uVar8;
  }
  uVar10 = 0;
  std::__cxx11::string::_M_replace
            ((ulong)&this->errmsg_,0,(char *)(this->errmsg_)._M_string_length,0x132218);
  lVar1 = *in_FS_OFFSET;
  __s = (char *)(lVar1 + -0x800);
  pcVar2 = (this->errmsg_)._M_dataplus._M_p;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,pcVar2,pcVar2 + (this->errmsg_)._M_string_length);
  uVar3 = snprintf(__s,0x800,"%s",local_50[0]);
  if ((int)uVar3 < 0) {
    *__s = '\0';
  }
  else {
    uVar10 = uVar3;
    if (0x7ff < (int)uVar3) {
      *(undefined1 *)(lVar1 + -1) = 0;
      uVar10 = 0x800;
    }
  }
  uVar8 = (ulong)uVar10;
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  if (uVar10 < 0x800) {
    pcVar9 = __s + uVar8;
    iVar4 = snprintf(pcVar9,0x800 - uVar8,"%s"," ( ");
    iVar5 = 0;
    if (iVar4 < 0) {
LAB_0011bf01:
      iVar4 = iVar5;
      *pcVar9 = '\0';
    }
    else {
      iVar5 = (int)(0x800 - uVar8);
      if (iVar5 <= iVar4) {
        pcVar9 = (char *)(lVar1 + -1);
        goto LAB_0011bf01;
      }
    }
    uVar8 = uVar8 + (long)iVar4;
  }
  if ((long)uVar8 < 0x800) {
    pcVar9 = __s + uVar8;
    iVar11 = 0x800 - (int)uVar8;
    iVar4 = snprintf(pcVar9,(long)iVar11,"%s"," ");
    iVar5 = 0;
    if (iVar4 < 0) {
LAB_0011bf52:
      iVar4 = iVar5;
      *pcVar9 = '\0';
    }
    else if (iVar11 <= iVar4) {
      pcVar9 = (char *)(lVar1 + -1);
      iVar5 = iVar11;
      goto LAB_0011bf52;
    }
    uVar8 = uVar8 + (long)iVar4;
  }
  if ((long)uVar8 < 0x800) {
    pcVar9 = __s + uVar8;
    iVar11 = 0x800 - (int)uVar8;
    iVar4 = snprintf(pcVar9,(long)iVar11,"%s"," ) : ");
    iVar5 = 0;
    if (iVar4 < 0) {
LAB_0011bfa3:
      iVar4 = iVar5;
      *pcVar9 = '\0';
    }
    else if (iVar11 <= iVar4) {
      pcVar9 = (char *)(lVar1 + -1);
      iVar5 = iVar11;
      goto LAB_0011bfa3;
    }
    uVar8 = uVar8 + (long)iVar4;
  }
  if ((long)uVar8 < 0x800) {
    pcVar9 = __s + uVar8;
    iVar4 = 0x800 - (int)uVar8;
    iVar5 = snprintf(pcVar9,(long)iVar4,"%d",0x131);
    if (-1 < iVar5) {
      if (iVar5 < iVar4) goto LAB_0011bff4;
      pcVar9 = (char *)(lVar1 + -1);
    }
    *pcVar9 = '\0';
  }
LAB_0011bff4:
  pIVar7 = zsummer::log4z::ILog4zManager::GetInstance();
  (*pIVar7->_vptr_ILog4zManager[8])(pIVar7,0,3,__s);
  return 0;
}

Assistant:

int TCPClient::Send(const char* data, std::size_t len)
{
    if (!data || len <= 0) {
        errmsg_ = "send data is null or len less than zero.";
        LOGE(errmsg_);
        return 0;
    }
    uv_async_send(&async_handle_);
    size_t iret = 0;
    while (!isuseraskforclosed_) {
        uv_mutex_lock(&mutex_writebuf_);
        iret += write_circularbuf_.write(data + iret, len - iret);
        uv_mutex_unlock(&mutex_writebuf_);
        if (iret < len) {
            ThreadSleep(100);
            continue;
        } else {
            break;
        }
    }
    uv_async_send(&async_handle_);
    return iret;
}